

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qurl.cpp
# Opt level: O2

bool __thiscall QUrl::isParentOf(QUrl *this,QUrl *childUrl)

{
  QUrlPrivate *pQVar1;
  bool bVar2;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_e0;
  QArrayDataPointer<char16_t> local_c8;
  QArrayDataPointer<char16_t> local_b0;
  QArrayDataPointer<char16_t> local_98;
  QArrayDataPointer<char16_t> local_80;
  QArrayDataPointer<char16_t> local_68;
  QArrayDataPointer<char16_t> local_48;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  local_48.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_48.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_48.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  path((QString *)&local_48,childUrl,(ComponentFormattingOptions)0x7f00000);
  if (this->d == (QUrlPrivate *)0x0) {
    scheme((QString *)&local_68,childUrl);
    if ((undefined1 *)local_68.size != (undefined1 *)0x0) {
      bVar2 = false;
      goto LAB_00241506;
    }
    authority((QString *)&local_80,childUrl,(ComponentFormattingOptions)0x0);
    if ((local_80.size == 0) && ((undefined1 *)local_48.size != (undefined1 *)0x0)) {
      bVar2 = *local_48.ptr == L'/';
    }
    else {
      bVar2 = false;
    }
  }
  else {
    local_68.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_68.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_68.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
    path((QString *)&local_68,this,(ComponentFormattingOptions)0x7f00000);
    scheme((QString *)&local_80,childUrl);
    if (local_80.size == 0) {
LAB_002413af:
      authority((QString *)&local_b0,childUrl,(ComponentFormattingOptions)0x0);
      if (local_b0.size == 0) {
LAB_002413fd:
        bVar2 = QString::startsWith((QString *)&local_48,(QString *)&local_68,CaseSensitive);
        if (bVar2) {
          bVar2 = QString::endsWith((QString *)&local_68,(QChar)0x2f,CaseSensitive);
          if ((!bVar2) || (bVar2 = true, (ulong)local_48.size <= (ulong)local_68.size)) {
            bVar2 = QString::endsWith((QString *)&local_68,(QChar)0x2f,CaseSensitive);
            if ((bVar2) || ((ulong)local_48.size <= (ulong)local_68.size)) goto LAB_002414a1;
            bVar2 = local_48.ptr[local_68.size] == L'/';
          }
        }
        else {
LAB_002414a1:
          bVar2 = false;
        }
        if (local_b0.size != 0) goto LAB_002414cf;
      }
      else {
        authority((QString *)&local_c8,this,(ComponentFormattingOptions)0x0);
        authority((QString *)&local_e0,childUrl,(ComponentFormattingOptions)0x0);
        bVar2 = ::comparesEqual((QString *)&local_c8,(QString *)&local_e0);
        if (bVar2) goto LAB_002413fd;
        bVar2 = false;
LAB_002414cf:
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_e0);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_c8);
      }
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_b0);
      if (local_80.size == 0) goto LAB_002414fc;
    }
    else {
      pQVar1 = this->d;
      scheme((QString *)&local_98,childUrl);
      bVar2 = ::comparesEqual(&pQVar1->scheme,(QString *)&local_98);
      if (bVar2) goto LAB_002413af;
      bVar2 = false;
    }
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_98);
  }
LAB_002414fc:
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_80);
LAB_00241506:
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_68);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_48);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_30) {
    __stack_chk_fail();
  }
  return bVar2;
}

Assistant:

bool QUrl::isParentOf(const QUrl &childUrl) const
{
    QString childPath = childUrl.path();

    if (!d)
        return ((childUrl.scheme().isEmpty())
            && (childUrl.authority().isEmpty())
            && childPath.size() > 0 && childPath.at(0) == u'/');

    QString ourPath = path();

    return ((childUrl.scheme().isEmpty() || d->scheme == childUrl.scheme())
            && (childUrl.authority().isEmpty() || authority() == childUrl.authority())
            &&  childPath.startsWith(ourPath)
            && ((ourPath.endsWith(u'/') && childPath.size() > ourPath.size())
                || (!ourPath.endsWith(u'/') && childPath.size() > ourPath.size()
                    && childPath.at(ourPath.size()) == u'/')));
}